

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

void xmlFreeParserCtxt(xmlParserCtxtPtr ctxt)

{
  _xmlSAXHandler *p_Var1;
  xmlNodePtr *ppxVar2;
  _xmlNode *p_Var3;
  _xmlAttr *p_Var4;
  char *pcVar5;
  xmlParserInputPtr input;
  _xmlSAXHandler *p_Var6;
  xmlNodePtr pxVar7;
  xmlAttrPtr pxVar8;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return;
  }
  while (input = inputPop(ctxt), input != (xmlParserInputPtr)0x0) {
    xmlFreeInputStream(input);
  }
  if (ctxt->spaceTab != (int *)0x0) {
    (*xmlFree)(ctxt->spaceTab);
  }
  if (ctxt->nameTab != (xmlChar **)0x0) {
    (*xmlFree)(ctxt->nameTab);
  }
  if (ctxt->nodeTab != (xmlNodePtr *)0x0) {
    (*xmlFree)(ctxt->nodeTab);
  }
  if (ctxt->nodeInfoTab != (xmlParserNodeInfo *)0x0) {
    (*xmlFree)(ctxt->nodeInfoTab);
  }
  if (ctxt->inputTab != (xmlParserInputPtr *)0x0) {
    (*xmlFree)(ctxt->inputTab);
  }
  if (ctxt->version != (xmlChar *)0x0) {
    (*xmlFree)(ctxt->version);
  }
  if (ctxt->encoding != (xmlChar *)0x0) {
    (*xmlFree)(ctxt->encoding);
  }
  if (ctxt->extSubURI != (xmlChar *)0x0) {
    (*xmlFree)(ctxt->extSubURI);
  }
  if (ctxt->extSubSystem != (xmlChar *)0x0) {
    (*xmlFree)(ctxt->extSubSystem);
  }
  p_Var1 = ctxt->sax;
  if ((p_Var1 != (_xmlSAXHandler *)0x0) &&
     (p_Var6 = (_xmlSAXHandler *)__xmlDefaultSAXHandler(), p_Var1 != p_Var6)) {
    (*xmlFree)(ctxt->sax);
  }
  if (ctxt->directory != (char *)0x0) {
    (*xmlFree)(ctxt->directory);
  }
  ppxVar2 = (ctxt->vctxt).nodeTab;
  if (ppxVar2 != (xmlNodePtr *)0x0) {
    (*xmlFree)(ppxVar2);
  }
  if (ctxt->atts != (xmlChar **)0x0) {
    (*xmlFree)(ctxt->atts);
  }
  if (ctxt->dict != (xmlDictPtr)0x0) {
    xmlDictFree(ctxt->dict);
  }
  if (ctxt->nsTab != (xmlChar **)0x0) {
    (*xmlFree)(ctxt->nsTab);
  }
  if (ctxt->pushTab != (xmlStartTag *)0x0) {
    (*xmlFree)(ctxt->pushTab);
  }
  if (ctxt->attallocs != (int *)0x0) {
    (*xmlFree)(ctxt->attallocs);
  }
  if (ctxt->attsDefault != (xmlHashTablePtr)0x0) {
    xmlHashFree(ctxt->attsDefault,xmlHashDefaultDeallocator);
  }
  if (ctxt->attsSpecial != (xmlHashTablePtr)0x0) {
    xmlHashFree(ctxt->attsSpecial,(xmlHashDeallocator)0x0);
  }
  pxVar7 = ctxt->freeElems;
  if (pxVar7 != (xmlNodePtr)0x0) {
    while (pxVar7 != (xmlNodePtr)0x0) {
      p_Var3 = pxVar7->next;
      (*xmlFree)(pxVar7);
      pxVar7 = p_Var3;
    }
  }
  pxVar8 = ctxt->freeAttrs;
  if (pxVar8 != (xmlAttrPtr)0x0) {
    while (pxVar8 != (xmlAttrPtr)0x0) {
      p_Var4 = pxVar8->next;
      (*xmlFree)(pxVar8);
      pxVar8 = p_Var4;
    }
  }
  pcVar5 = (ctxt->lastError).message;
  if (pcVar5 != (char *)0x0) {
    (*xmlFree)(pcVar5);
  }
  pcVar5 = (ctxt->lastError).file;
  if (pcVar5 != (char *)0x0) {
    (*xmlFree)(pcVar5);
  }
  pcVar5 = (ctxt->lastError).str1;
  if (pcVar5 != (char *)0x0) {
    (*xmlFree)(pcVar5);
  }
  pcVar5 = (ctxt->lastError).str2;
  if (pcVar5 != (char *)0x0) {
    (*xmlFree)(pcVar5);
  }
  pcVar5 = (ctxt->lastError).str3;
  if (pcVar5 != (char *)0x0) {
    (*xmlFree)(pcVar5);
  }
  if (ctxt->catalogs != (void *)0x0) {
    xmlCatalogFreeLocal(ctxt->catalogs);
  }
  (*xmlFree)(ctxt);
  return;
}

Assistant:

void
xmlFreeParserCtxt(xmlParserCtxtPtr ctxt)
{
    xmlParserInputPtr input;

    if (ctxt == NULL) return;

    while ((input = inputPop(ctxt)) != NULL) { /* Non consuming */
        xmlFreeInputStream(input);
    }
    if (ctxt->spaceTab != NULL) xmlFree(ctxt->spaceTab);
    if (ctxt->nameTab != NULL) xmlFree((xmlChar * *)ctxt->nameTab);
    if (ctxt->nodeTab != NULL) xmlFree(ctxt->nodeTab);
    if (ctxt->nodeInfoTab != NULL) xmlFree(ctxt->nodeInfoTab);
    if (ctxt->inputTab != NULL) xmlFree(ctxt->inputTab);
    if (ctxt->version != NULL) xmlFree((char *) ctxt->version);
    if (ctxt->encoding != NULL) xmlFree((char *) ctxt->encoding);
    if (ctxt->extSubURI != NULL) xmlFree((char *) ctxt->extSubURI);
    if (ctxt->extSubSystem != NULL) xmlFree((char *) ctxt->extSubSystem);
#ifdef LIBXML_SAX1_ENABLED
    if ((ctxt->sax != NULL) &&
        (ctxt->sax != (xmlSAXHandlerPtr) &xmlDefaultSAXHandler))
#else
    if (ctxt->sax != NULL)
#endif /* LIBXML_SAX1_ENABLED */
        xmlFree(ctxt->sax);
    if (ctxt->directory != NULL) xmlFree((char *) ctxt->directory);
    if (ctxt->vctxt.nodeTab != NULL) xmlFree(ctxt->vctxt.nodeTab);
    if (ctxt->atts != NULL) xmlFree((xmlChar * *)ctxt->atts);
    if (ctxt->dict != NULL) xmlDictFree(ctxt->dict);
    if (ctxt->nsTab != NULL) xmlFree((char *) ctxt->nsTab);
    if (ctxt->pushTab != NULL) xmlFree(ctxt->pushTab);
    if (ctxt->attallocs != NULL) xmlFree(ctxt->attallocs);
    if (ctxt->attsDefault != NULL)
        xmlHashFree(ctxt->attsDefault, xmlHashDefaultDeallocator);
    if (ctxt->attsSpecial != NULL)
        xmlHashFree(ctxt->attsSpecial, NULL);
    if (ctxt->freeElems != NULL) {
        xmlNodePtr cur, next;

	cur = ctxt->freeElems;
	while (cur != NULL) {
	    next = cur->next;
	    xmlFree(cur);
	    cur = next;
	}
    }
    if (ctxt->freeAttrs != NULL) {
        xmlAttrPtr cur, next;

	cur = ctxt->freeAttrs;
	while (cur != NULL) {
	    next = cur->next;
	    xmlFree(cur);
	    cur = next;
	}
    }
    /*
     * cleanup the error strings
     */
    if (ctxt->lastError.message != NULL)
        xmlFree(ctxt->lastError.message);
    if (ctxt->lastError.file != NULL)
        xmlFree(ctxt->lastError.file);
    if (ctxt->lastError.str1 != NULL)
        xmlFree(ctxt->lastError.str1);
    if (ctxt->lastError.str2 != NULL)
        xmlFree(ctxt->lastError.str2);
    if (ctxt->lastError.str3 != NULL)
        xmlFree(ctxt->lastError.str3);

#ifdef LIBXML_CATALOG_ENABLED
    if (ctxt->catalogs != NULL)
	xmlCatalogFreeLocal(ctxt->catalogs);
#endif
    xmlFree(ctxt);
}